

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall Script_Script_Test::~Script_Script_Test(Script_Script_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, Script) {
  size_t size = 0;
  Script script;
  EXPECT_STREQ(script.GetHex().c_str(), "");
  EXPECT_EQ(script.IsEmpty(), true);
  EXPECT_EQ(script.GetData().GetDataSize(), size);
  EXPECT_EQ(script.GetElementList().size(), size);
}